

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cpp
# Opt level: O2

string * __thiscall
embree::stringOfCPUModel_abi_cxx11_(string *__return_storage_ptr__,embree *this,CPU model)

{
  char *pcVar1;
  allocator local_9;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar1 = "Xeon Ice Lake";
    break;
  case 1:
    pcVar1 = "Core Ice Lake";
    break;
  case 2:
    pcVar1 = "Core Tiger Lake";
    break;
  case 3:
    pcVar1 = "Core Comet Lake";
    break;
  case 4:
    pcVar1 = "Core Cannon Lake";
    break;
  case 5:
    pcVar1 = "Core Kaby Lake";
    break;
  case 6:
    pcVar1 = "Xeon Sky Lake";
    break;
  case 7:
    pcVar1 = "Core Sky Lake";
    break;
  case 8:
    pcVar1 = "Xeon Phi Knights Mill";
    break;
  case 9:
    pcVar1 = "Xeon Phi Knights Landing";
    break;
  case 10:
    pcVar1 = "Xeon Broadwell";
    break;
  case 0xb:
    pcVar1 = "Core Broadwell";
    break;
  case 0xc:
    pcVar1 = "Xeon Haswell";
    break;
  case 0xd:
    pcVar1 = "Core Haswell";
    break;
  case 0xe:
    pcVar1 = "Xeon Ivy Bridge";
    break;
  case 0xf:
    pcVar1 = "Core Ivy Bridge";
    break;
  case 0x10:
    pcVar1 = "Sandy Bridge";
    break;
  case 0x11:
    pcVar1 = "Nehalem";
    break;
  case 0x12:
    pcVar1 = "Core2";
    break;
  case 0x13:
    pcVar1 = "Core";
    break;
  case 0x14:
    pcVar1 = "ARM";
    break;
  case 0x15:
    pcVar1 = "Unknown CPU";
    break;
  default:
    pcVar1 = "Unknown CPU (error)";
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string stringOfCPUModel(CPU model)
  {
    switch (model) {
    case CPU::XEON_ICE_LAKE           : return "Xeon Ice Lake";
    case CPU::CORE_ICE_LAKE           : return "Core Ice Lake";
    case CPU::CORE_TIGER_LAKE         : return "Core Tiger Lake";
    case CPU::CORE_COMET_LAKE         : return "Core Comet Lake";
    case CPU::CORE_CANNON_LAKE        : return "Core Cannon Lake";
    case CPU::CORE_KABY_LAKE          : return "Core Kaby Lake";
    case CPU::XEON_SKY_LAKE           : return "Xeon Sky Lake";
    case CPU::CORE_SKY_LAKE           : return "Core Sky Lake";
    case CPU::XEON_PHI_KNIGHTS_MILL   : return "Xeon Phi Knights Mill";
    case CPU::XEON_PHI_KNIGHTS_LANDING: return "Xeon Phi Knights Landing";
    case CPU::XEON_BROADWELL          : return "Xeon Broadwell";
    case CPU::CORE_BROADWELL          : return "Core Broadwell";
    case CPU::XEON_HASWELL            : return "Xeon Haswell";
    case CPU::CORE_HASWELL            : return "Core Haswell";
    case CPU::XEON_IVY_BRIDGE         : return "Xeon Ivy Bridge";
    case CPU::CORE_IVY_BRIDGE         : return "Core Ivy Bridge";
    case CPU::SANDY_BRIDGE            : return "Sandy Bridge";
    case CPU::NEHALEM                 : return "Nehalem";
    case CPU::CORE2                   : return "Core2";
    case CPU::CORE1                   : return "Core";
    case CPU::ARM                     : return "ARM";
    case CPU::UNKNOWN                 : return "Unknown CPU";
    }
    return "Unknown CPU (error)";
  }